

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_SubDEdgePtrLink>::Append
          (ON_SimpleArray<ON_SubDEdgePtrLink> *this,ON_SubDEdgePtrLink *x)

{
  ON_SubDEdgePtrLink *pOVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDEdgePtrLink *memblock;
  int iVar5;
  uint uVar6;
  
  iVar2 = this->m_count;
  memblock = x;
  if (iVar2 == this->m_capacity) {
    if (iVar2 < 8 || (ulong)((long)iVar2 << 4) < 0x10000001) {
      uVar6 = 4;
      if (2 < iVar2) {
        uVar6 = iVar2 * 2;
      }
    }
    else {
      iVar5 = 0x1000008;
      if (iVar2 < 0x1000008) {
        iVar5 = iVar2;
      }
      uVar6 = iVar5 + iVar2;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_SubDEdgePtrLink *)onmalloc(0x10);
      uVar3 = x->m_index;
      uVar4 = x->m_nbr_index;
      (memblock->m_ep).m_ptr = (x->m_ep).m_ptr;
      memblock->m_index = uVar3;
      memblock->m_nbr_index = uVar4;
    }
    if ((uint)this->m_capacity < uVar6) {
      SetCapacity(this,(long)(int)uVar6);
    }
    if (this->m_a == (ON_SubDEdgePtrLink *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  uVar6 = memblock->m_index;
  uVar3 = memblock->m_nbr_index;
  pOVar1 = this->m_a + iVar2;
  (pOVar1->m_ep).m_ptr = (memblock->m_ep).m_ptr;
  pOVar1->m_index = uVar6;
  pOVar1->m_nbr_index = uVar3;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}